

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

_Bool regime_is_user(CPUARMState_conflict *env,ARMMMUIdx mmu_idx)

{
  uint uVar1;
  
  uVar1 = (int)env - 0x10;
  if (uVar1 < 0x37) {
    if ((0x55000000010082U >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
      return true;
    }
    if ((0xdUL >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                 ,0x2386,(char *)0x0);
    }
  }
  return false;
}

Assistant:

static inline bool regime_is_user(CPUARMState *env, ARMMMUIdx mmu_idx)
{
    switch (mmu_idx) {
    case ARMMMUIdx_SE10_0:
    case ARMMMUIdx_E20_0:
    case ARMMMUIdx_Stage1_E0:
    case ARMMMUIdx_MUser:
    case ARMMMUIdx_MSUser:
    case ARMMMUIdx_MUserNegPri:
    case ARMMMUIdx_MSUserNegPri:
        return true;
    default:
        return false;
    case ARMMMUIdx_E10_0:
    case ARMMMUIdx_E10_1:
    case ARMMMUIdx_E10_1_PAN:
        g_assert_not_reached();
        // never reach here
        return false;
    }
}